

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O3

void glmc_rotate_x(vec4 *m,float rad,vec4 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar13 = cosf(rad);
  fVar14 = sinf(rad);
  fVar1 = (*m)[1];
  fVar2 = (*m)[2];
  fVar3 = (*m)[3];
  fVar4 = m[1][0];
  fVar5 = m[1][1];
  fVar6 = m[1][2];
  fVar7 = m[1][3];
  fVar8 = m[2][0];
  fVar9 = m[2][1];
  fVar10 = m[2][2];
  fVar11 = m[2][3];
  fVar15 = (*m)[0] * 0.0;
  fVar16 = fVar1 * 0.0;
  fVar17 = fVar2 * 0.0;
  fVar18 = fVar3 * 0.0;
  (*dest)[0] = fVar8 * 0.0 + fVar4 * 0.0 + (*m)[0];
  (*dest)[1] = fVar9 * 0.0 + fVar5 * 0.0 + fVar1;
  (*dest)[2] = fVar10 * 0.0 + fVar6 * 0.0 + fVar2;
  (*dest)[3] = fVar11 * 0.0 + fVar7 * 0.0 + fVar3;
  dest[1][0] = fVar14 * fVar8 + fVar13 * fVar4 + fVar15;
  dest[1][1] = fVar14 * fVar9 + fVar13 * fVar5 + fVar16;
  dest[1][2] = fVar14 * fVar10 + fVar13 * fVar6 + fVar17;
  dest[1][3] = fVar14 * fVar11 + fVar13 * fVar7 + fVar18;
  dest[2][0] = fVar13 * fVar8 + (fVar15 - fVar4 * fVar14);
  dest[2][1] = fVar13 * fVar9 + (fVar16 - fVar5 * fVar14);
  dest[2][2] = fVar13 * fVar10 + (fVar17 - fVar6 * fVar14);
  dest[2][3] = fVar13 * fVar11 + (fVar18 - fVar7 * fVar14);
  uVar12 = *(undefined8 *)(m[3] + 2);
  *(undefined8 *)dest[3] = *(undefined8 *)m[3];
  *(undefined8 *)(dest[3] + 2) = uVar12;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate_x(mat4 m, float rad, mat4 dest) {
  glm_rotate_x(m, rad, dest);
}